

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O3

bool __thiscall search::BSTree::find(BSTree *this,int key,Record **r)

{
  BSTNode *cur;
  BSTNode *pBVar1;
  
  pBVar1 = this->root_;
  while( true ) {
    if (pBVar1 == (BSTNode *)0x0) {
      return false;
    }
    if (pBVar1->key_ == key) break;
    pBVar1 = (&pBVar1->left_)[pBVar1->key_ < key];
  }
  *r = pBVar1;
  return true;
}

Assistant:

bool BSTree::find(int key, Record*& r)
    {
        if (!root_)
            return false;
        auto ret =  root_->search(key);
        if (ret)
        {
            r = ret;
            return true;
        }
        else
            return false;
    }